

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_csm.c
# Opt level: O2

void * CSM_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_ErrorCode errcode;
  int iVar1;
  void *opaque;
  void *pvVar2;
  short sVar3;
  PHYSFS_uint8 fn_len;
  PHYSFS_uint16 count;
  PHYSFS_uint32 size;
  PHYSFS_uint32 local_44;
  PHYSFS_uint8 buf [4];
  char name_1 [12];
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_csm.c"
                  ,0x49,"void *CSM_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,buf,4);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    if (buf == (PHYSFS_uint8  [4])0x64695343) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,&count,2);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      count = PHYSFS_swapULE16(count);
      opaque = UNPK_openArchive(io,0,1);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      sVar3 = count + 1;
      do {
        sVar3 = sVar3 + -1;
        if (sVar3 == 0) {
          return opaque;
        }
        iVar1 = __PHYSFS_readAll(io,&fn_len,1);
        if ((((iVar1 == 0) || (iVar1 = __PHYSFS_readAll(io,name_1,0xc), iVar1 == 0)) ||
            (iVar1 = __PHYSFS_readAll(io,&size,4), iVar1 == 0)) ||
           (iVar1 = __PHYSFS_readAll(io,&local_44,4), iVar1 == 0)) break;
        if (0xc < fn_len) {
          fn_len = '\f';
        }
        name_1[fn_len] = '\0';
        size = PHYSFS_swapULE32(size);
        local_44 = PHYSFS_swapULE32(local_44);
        pvVar2 = UNPK_addEntry(opaque,name_1,0,-1,-1,(ulong)local_44,(ulong)size);
      } while (pvVar2 != (void *)0x0);
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *CSM_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[4];
    PHYSFS_uint16 count;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if (memcmp(buf, "CSid", 4) != 0)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof (count)), NULL);
    count = PHYSFS_swapULE16(count);


    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!csmLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}